

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O0

double extract_spR<PredictionData<float,long>,long>
                 (PredictionData<float,_long> *prediction_data,long *row_st,long *row_end,
                 size_t col_num)

{
  long *plVar1;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  long *search_res;
  long *in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  if (in_RDX == in_RSI) {
    local_8 = 0.0;
  }
  else {
    plVar1 = std::lower_bound<long_const*,long>(in_RDX,in_RCX,in_stack_ffffffffffffffd0);
    if ((plVar1 == in_RDX) || ((long *)*plVar1 != in_RCX)) {
      local_8 = 0.0;
    }
    else {
      local_8 = (double)*(float *)(*(long *)(in_RDI + 0x48) +
                                  ((long)plVar1 - *(long *)(in_RDI + 0x50) >> 3) * 4);
    }
  }
  return local_8;
}

Assistant:

double extract_spR(const PredictionData &prediction_data, const sparse_ix *row_st, const sparse_ix *row_end, size_t col_num) noexcept
{
    if (row_end == row_st)
        return 0.;
    const sparse_ix *search_res = std::lower_bound(row_st, row_end, (sparse_ix) col_num);
    if (search_res == row_end || *search_res != (sparse_ix)col_num)
        return 0.;
    else
        return prediction_data.Xr[search_res - prediction_data.Xr_ind];
}